

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientImpl.cpp
# Opt level: O0

void SL::WS_LITE::
     ConnectHandshake<std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>const>
               (shared_ptr<SL::WS_LITE::HubContext> *self,
               shared_ptr<SL::WS_LITE::WebSocket<false,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>_>
               *socket,string *host,string *endpoint,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *extraheaders)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  bool bVar1;
  result_type rVar2;
  element_type *peVar3;
  ostream *poVar4;
  element_type *peVar5;
  element_type *b;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ascii;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input;
  undefined1 auVar6 [16];
  type_conflict local_15e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1598;
  undefined1 local_1578 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> accept_sha1;
  value_type *h;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> nonce_base64;
  undefined1 local_1510 [4];
  int c;
  random_device rd;
  uniform_int_distribution<unsigned_int> dist;
  string nonce;
  ostream local_150 [8];
  ostream request;
  undefined1 local_40 [8];
  shared_ptr<asio::basic_streambuf<std::allocator<char>_>_> write_buffer;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *extraheaders_local;
  string *endpoint_local;
  string *host_local;
  shared_ptr<SL::WS_LITE::WebSocket<false,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>_>
  *socket_local;
  shared_ptr<SL::WS_LITE::HubContext> *self_local;
  
  write_buffer.
  super___shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraheaders;
  std::make_shared<asio::basic_streambuf<std::allocator<char>>>();
  peVar3 = std::
           __shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>::
           get((__shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                *)local_40);
  std::ostream::ostream(local_150,&peVar3->super_streambuf);
  poVar4 = std::operator<<(local_150,"GET ");
  poVar4 = std::operator<<(poVar4,(string *)endpoint);
  std::operator<<(poVar4," HTTP/1.1\r\n");
  poVar4 = std::operator<<(local_150,"Host:");
  poVar4 = std::operator<<(poVar4,(string *)host);
  std::operator<<(poVar4,"\r\n");
  std::operator<<(local_150,"Upgrade: websocket\r\n");
  std::operator<<(local_150,"Connection: Upgrade\r\n");
  std::__cxx11::string::string((string *)&dist);
  std::__cxx11::string::resize((ulong)&dist);
  std::uniform_int_distribution<unsigned_int>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_int> *)((long)&rd.field_0 + 0x1380),0,0xff);
  std::random_device::random_device((random_device *)local_1510);
  ascii = extraout_RDX;
  for (nonce_base64.field_2._12_4_ = 0; (int)nonce_base64.field_2._12_4_ < 0x10;
      nonce_base64.field_2._12_4_ = nonce_base64.field_2._12_4_ + 1) {
    rVar2 = std::uniform_int_distribution<unsigned_int>::operator()
                      ((uniform_int_distribution<unsigned_int> *)((long)&rd.field_0 + 0x1380),
                       (random_device *)local_1510);
    auVar6 = std::__cxx11::string::operator[]((ulong)&dist);
    ascii = auVar6._8_8_;
    *auVar6._0_8_ = (char)rVar2;
  }
  Base64encode<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,
             (WS_LITE *)&dist,ascii);
  poVar4 = std::operator<<(local_150,"Sec-WebSocket-Key:");
  poVar4 = std::operator<<(poVar4,(string *)&__range2);
  std::operator<<(poVar4,"\r\n");
  std::operator<<(local_150,"Sec-WebSocket-Version: 13\r\n");
  this = write_buffer.
         super___shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount;
  __end2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)write_buffer.
                      super___shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi);
  h = (value_type *)
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)this._M_pi);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                       ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                         *)&h);
    if (!bVar1) break;
    accept_sha1.field_2._8_8_ =
         std::__detail::
         _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
         ::operator*(&__end2);
    poVar4 = std::operator<<(local_150,(string *)accept_sha1.field_2._8_8_);
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = std::operator<<(poVar4,(string *)(accept_sha1.field_2._8_8_ + 0x20));
    std::operator<<(poVar4,"\r\n");
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
    ::operator++(&__end2);
  }
  std::operator<<(local_150,"\r\n");
  std::operator+(&local_1598,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ws_magic_string_abi_cxx11_);
  SHA1<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1578,
             (WS_LITE *)&local_1598,input);
  std::__cxx11::string::~string((string *)&local_1598);
  peVar5 = std::
           __shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SL::WS_LITE::WebSocket<false,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)socket);
  b = std::
      __shared_ptr_access<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator*((__shared_ptr_access<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)local_40);
  std::shared_ptr<asio::basic_streambuf<std::allocator<char>_>_>::shared_ptr
            (&local_15e8.write_buffer,
             (shared_ptr<asio::basic_streambuf<std::allocator<char>_>_> *)local_40);
  std::__cxx11::string::string((string *)&local_15e8.accept_sha1,(string *)local_1578);
  std::
  shared_ptr<SL::WS_LITE::WebSocket<false,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>_>
  ::shared_ptr(&local_15e8.socket,socket);
  std::shared_ptr<SL::WS_LITE::HubContext>::shared_ptr(&local_15e8.self,self);
  asio::
  async_write<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>,std::allocator<char>,SL::WS_LITE::ConnectHandshake<std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>const>(std::shared_ptr<SL::WS_LITE::HubContext>,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)::_lambda(std::error_code_const&,unsigned_long)_1_>
            (&peVar5->Socket,b,&local_15e8);
  ConnectHandshake<std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>const>(std::shared_ptr<SL::WS_LITE::HubContext>,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
  ::{lambda(std::error_code_const&,unsigned_long)#1}::~error_code
            ((_lambda_std__error_code_const__unsigned_long__1_ *)&local_15e8);
  std::__cxx11::string::~string((string *)local_1578);
  std::__cxx11::string::~string((string *)&__range2);
  std::random_device::~random_device((random_device *)local_1510);
  std::__cxx11::string::~string((string *)&dist);
  std::ostream::~ostream(local_150);
  std::shared_ptr<asio::basic_streambuf<std::allocator<char>_>_>::~shared_ptr
            ((shared_ptr<asio::basic_streambuf<std::allocator<char>_>_> *)local_40);
  return;
}

Assistant:

void ConnectHandshake(const std::shared_ptr<HubContext> self, SOCKETTYPE &socket, const std::string &host, const std::string &endpoint,
                          const std::unordered_map<std::string, std::string> &extraheaders)
    {
        auto write_buffer(std::make_shared<asio::streambuf>());
        std::ostream request(write_buffer.get());

        request << "GET " << endpoint << " HTTP/1.1\r\n";
        request << "Host:" << host << "\r\n";
        request << "Upgrade: websocket\r\n";
        request << "Connection: Upgrade\r\n";

        // Make random 16-byte nonce
        std::string nonce;
        nonce.resize(16);
        std::uniform_int_distribution<unsigned int> dist(0, 255);
        std::random_device rd;
        for (int c = 0; c < 16; c++) {
            nonce[c] = static_cast<unsigned char>(dist(rd));
        }

        auto nonce_base64 = Base64encode(nonce);
        request << "Sec-WebSocket-Key:" << nonce_base64 << "\r\n";
        request << "Sec-WebSocket-Version: 13\r\n";
        for (auto &h : extraheaders) {
            request << h.first << ":" << h.second << "\r\n";
        }
        //  request << "" << HTTP_ENDLINE;
        //  request << HTTP_SECWEBSOCKETEXTENSIONS << HTTP_KEYVALUEDELIM << PERMESSAGEDEFLATE << HTTP_ENDLINE;
        request << "\r\n";

        auto accept_sha1 = SHA1(nonce_base64 + ws_magic_string);

        asio::async_write(
            socket->Socket, *write_buffer, [write_buffer, accept_sha1, socket, self](const std::error_code &ec, size_t bytes_transferred) {
                UNUSED(bytes_transferred);
                if (!ec) {
                    SL_WS_LITE_LOG(Logging_Levels::INFO_log_level, "Sent Handshake bytes " << bytes_transferred);
                    auto read_buffer(std::make_shared<asio::streambuf>());
                    asio::async_read_until(socket->Socket, *read_buffer, "\r\n\r\n",
                                           [read_buffer, accept_sha1, socket, self](const std::error_code &ec, size_t bytes_transferred) {
                                               UNUSED(bytes_transferred);
                                               if (!ec) {
                                                   SL_WS_LITE_LOG(Logging_Levels::INFO_log_level, "Read Handshake bytes " << bytes_transferred
                                                                                                                          << "  sizeof read_buffer "
                                                                                                                          << read_buffer->size());

                                                   auto header = ParseHeader(asio::buffer_cast<const char *>(read_buffer->data()));
                                                   auto sockey = std::find_if(std::begin(header.Values), std::end(header.Values),
                                                                              [](HeaderKeyValue k) { return k.Key == "Sec-WebSocket-Accept"; });

                                                   if (sockey == std::end(header.Values)) {
                                                       return;
                                                   }
                                                   if (Base64decode(sockey->Value) == accept_sha1) {

                                                       SL_WS_LITE_LOG(Logging_Levels::INFO_log_level, "Connected ");

                                                       socket->SocketStatus_ = SocketStatus::CONNECTED;
                                                       start_ping<false>(socket, std::chrono::seconds(5));
                                                       if (socket->Parent->onConnection) {
                                                           socket->Parent->onConnection(socket, header);
                                                       }
                                                       ReadHeaderStart<false>(socket, read_buffer);
                                                   }
                                                   else {
                                                       socket->SocketStatus_ = SocketStatus::CLOSED;
                                                       SL_WS_LITE_LOG(Logging_Levels::INFO_log_level, "WebSocket handshake failed  ");
                                                       if (socket->Parent->onDisconnection) {
                                                           socket->Parent->onDisconnection(socket, 1002, "WebSocket handshake failed  ");
                                                       }
                                                   }
                                               }
                                               else {
                                                   socket->SocketStatus_ = SocketStatus::CLOSED;
                                                   SL_WS_LITE_LOG(Logging_Levels::INFO_log_level, "async_read_until failed  " << ec.message());
                                                   if (socket->Parent->onDisconnection) {
                                                       socket->Parent->onDisconnection(socket, 1002, "async_read_until failed  " + ec.message());
                                                   }
                                               }
                                           });
                }
                else {
                    socket->SocketStatus_ = SocketStatus::CLOSED;
                    SL_WS_LITE_LOG(Logging_Levels::INFO_log_level, "Failed sending handshake" << ec.message());
                    if (socket->Parent->onDisconnection) {
                        socket->Parent->onDisconnection(socket, 1002, "Failed sending handshake" + ec.message());
                    }
                }
            });
    }